

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unixClose(unqlite_file *id)

{
  unixFile *pFile;
  int rc;
  unqlite_file *id_local;
  
  pFile._4_4_ = 0;
  if (id != (unqlite_file *)0x0) {
    unixUnlock(id,0);
    unixEnterMutex();
    if ((id[1].pMethods != (unqlite_io_methods *)0x0) &&
       (*(int *)((long)&(id[1].pMethods)->xWrite + 4) != 0)) {
      setPendingFd((unixFile *)id);
    }
    releaseInodeInfo((unixFile *)id);
    pFile._4_4_ = closeUnixFile(id);
    unixLeaveMutex();
  }
  return pFile._4_4_;
}

Assistant:

static int unixClose(unqlite_file *id){
  int rc = UNQLITE_OK;
  if( id ){
    unixFile *pFile = (unixFile *)id;
    unixUnlock(id, NO_LOCK);
    unixEnterMutex();
    if( pFile->pInode && pFile->pInode->nLock ){
      /* If there are outstanding locks, do not actually close the file just
      ** yet because that would clear those locks.  Instead, add the file
      ** descriptor to pInode->pUnused list.  It will be automatically closed 
      ** when the last lock is cleared.
      */
      setPendingFd(pFile);
    }
    releaseInodeInfo(pFile);
    rc = closeUnixFile(id);
    unixLeaveMutex();
  }
  return rc;
}